

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::switch_statement::switch_statement
          (switch_statement *this,source_extend *extend,expression_ptr *e,clause_list *cl)

{
  bool bVar1;
  clause_list *cl_local;
  expression_ptr *e_local;
  source_extend *extend_local;
  switch_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__switch_statement_00298860;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr(&this->e_,e);
  std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::vector(&this->cl_,cl);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->e_);
  if (!bVar1) {
    __assert_fail("e_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x353,
                  "mjs::switch_statement::switch_statement(const source_extend &, expression_ptr &&, clause_list &&)"
                 );
  }
  return;
}

Assistant:

explicit switch_statement(const source_extend& extend, expression_ptr&& e, clause_list&& cl) : statement(extend), e_(std::move(e)), cl_(std::move(cl)) {
        assert(e_);
    }